

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_statistics.cpp
# Opt level: O2

BaseStatistics *
duckdb::BaseStatistics::CreateEmptyType(BaseStatistics *__return_storage_ptr__,LogicalType *type)

{
  StatisticsType SVar1;
  LogicalType *this;
  LogicalType LStack_a8;
  LogicalType local_90;
  LogicalType local_78;
  LogicalType local_60;
  LogicalType local_48;
  LogicalType local_30;
  
  this = &LStack_a8;
  SVar1 = GetStatsType(type);
  switch(SVar1) {
  case NUMERIC_STATS:
    this = &local_30;
    LogicalType::LogicalType(this,type);
    NumericStats::CreateEmpty(__return_storage_ptr__,this);
    break;
  case STRING_STATS:
    this = &local_48;
    LogicalType::LogicalType(this,type);
    StringStats::CreateEmpty(__return_storage_ptr__,this);
    break;
  case LIST_STATS:
    this = &local_60;
    LogicalType::LogicalType(this,type);
    ListStats::CreateEmpty(__return_storage_ptr__,this);
    break;
  case STRUCT_STATS:
    this = &local_78;
    LogicalType::LogicalType(this,type);
    StructStats::CreateEmpty(__return_storage_ptr__,this);
    break;
  default:
    LogicalType::LogicalType(&LStack_a8,type);
    BaseStatistics(__return_storage_ptr__,&LStack_a8);
    break;
  case ARRAY_STATS:
    this = &local_90;
    LogicalType::LogicalType(this,type);
    ArrayStats::CreateEmpty(__return_storage_ptr__,this);
  }
  LogicalType::~LogicalType(this);
  return __return_storage_ptr__;
}

Assistant:

BaseStatistics BaseStatistics::CreateEmptyType(LogicalType type) {
	switch (GetStatsType(type)) {
	case StatisticsType::NUMERIC_STATS:
		return NumericStats::CreateEmpty(std::move(type));
	case StatisticsType::STRING_STATS:
		return StringStats::CreateEmpty(std::move(type));
	case StatisticsType::LIST_STATS:
		return ListStats::CreateEmpty(std::move(type));
	case StatisticsType::STRUCT_STATS:
		return StructStats::CreateEmpty(std::move(type));
	case StatisticsType::ARRAY_STATS:
		return ArrayStats::CreateEmpty(std::move(type));
	default:
		return BaseStatistics(std::move(type));
	}
}